

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O3

void __thiscall
embree::XMLWriter::store(XMLWriter *this,Ref<embree::SceneGraph::SubdivMeshNode> *mesh,ssize_t id)

{
  MaterialNode *pMVar1;
  pointer pvVar2;
  SubdivMeshNode *pSVar3;
  int __oflag;
  int __oflag_00;
  vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *p;
  pointer pvVar4;
  pointer pvVar5;
  Ref<embree::SceneGraph::MaterialNode> local_f0;
  undefined1 *local_e8 [2];
  undefined1 local_d8 [16];
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"SubdivisionMesh","");
  open(this,(char *)local_48,(int)id);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  pMVar1 = (mesh->ptr->material).ptr;
  local_f0.ptr = pMVar1;
  if (pMVar1 != (MaterialNode *)0x0) {
    (*(pMVar1->super_Node).super_RefCount._vptr_RefCount[2])(pMVar1);
  }
  store(this,&local_f0);
  if (pMVar1 != (MaterialNode *)0x0) {
    (*(pMVar1->super_Node).super_RefCount._vptr_RefCount[3])(pMVar1);
  }
  if ((long)(mesh->ptr->positions).
            super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(mesh->ptr->positions).
            super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 0x20) {
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"animated_positions","");
    open(this,(char *)local_68,__oflag);
    if (local_68[0] != local_58) {
      operator_delete(local_68[0]);
    }
  }
  pvVar2 = (mesh->ptr->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar5 = (mesh->ptr->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pvVar4 = pvVar2;
  if (pvVar2 != pvVar5) {
    do {
      store(this,"positions",pvVar2);
      pvVar2 = pvVar2 + 1;
    } while (pvVar2 != pvVar5);
    pvVar2 = (mesh->ptr->positions).
             super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pvVar4 = (mesh->ptr->positions).
             super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  if ((long)pvVar2 - (long)pvVar4 != 0x20) {
    local_88[0] = local_78;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"animated_positions","");
    close(this,(int)(string *)local_88);
    if (local_88[0] != local_78) {
      operator_delete(local_88[0]);
    }
  }
  if ((long)(mesh->ptr->positions).
            super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(mesh->ptr->positions).
            super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 0x20) {
    local_a8[0] = local_98;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"animated_normals","");
    open(this,(char *)local_a8,__oflag_00);
    if (local_a8[0] != local_98) {
      operator_delete(local_a8[0]);
    }
  }
  pSVar3 = mesh->ptr;
  pvVar5 = (pSVar3->normals).
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (pSVar3->normals).
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar5 != pvVar2) {
    do {
      store(this,"normals",pvVar5);
      pvVar5 = pvVar5 + 1;
    } while (pvVar5 != pvVar2);
    pSVar3 = mesh->ptr;
  }
  if ((long)(pSVar3->positions).
            super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(pSVar3->positions).
            super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 0x20) {
    local_c8[0] = local_b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"animated_normals","");
    close(this,(int)(string *)local_c8);
    if (local_c8[0] != local_b8) {
      operator_delete(local_c8[0]);
    }
  }
  store<embree::Vec2<float>>(this,"texcoords",&mesh->ptr->texcoords);
  store<unsigned_int>(this,"position_indices",&mesh->ptr->position_indices);
  store<unsigned_int>(this,"normal_indices",&mesh->ptr->normal_indices);
  store<unsigned_int>(this,"texcoord_indices",&mesh->ptr->texcoord_indices);
  store<unsigned_int>(this,"faces",&mesh->ptr->verticesPerFace);
  store<unsigned_int>(this,"holes",&mesh->ptr->holes);
  store<embree::Vec2<int>>(this,"edge_creases",&mesh->ptr->edge_creases);
  store<float>(this,"edge_crease_weights",&mesh->ptr->edge_crease_weights);
  store<unsigned_int>(this,"vertex_creases",&mesh->ptr->vertex_creases);
  store<float>(this,"vertex_crease_weights",&mesh->ptr->vertex_crease_weights);
  local_e8[0] = local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"SubdivisionMesh","");
  close(this,(int)(string *)local_e8);
  if (local_e8[0] != local_d8) {
    operator_delete(local_e8[0]);
  }
  return;
}

Assistant:

void XMLWriter::store(Ref<SceneGraph::SubdivMeshNode> mesh, ssize_t id)
  {
    open("SubdivisionMesh",id);
    store(mesh->material);
    
    if (mesh->numTimeSteps() != 1) open("animated_positions");
    for (const auto& p : mesh->positions) store("positions",p);
    if (mesh->numTimeSteps() != 1) close("animated_positions");

    if (mesh->numTimeSteps() != 1) open("animated_normals");
    for (const auto& p : mesh->normals) store("normals",p);
    if (mesh->numTimeSteps() != 1) close("animated_normals");

    store("texcoords",mesh->texcoords);
    store("position_indices",mesh->position_indices);
    store("normal_indices",mesh->normal_indices);
    store("texcoord_indices",mesh->texcoord_indices);
    store("faces",mesh->verticesPerFace);
    store("holes",mesh->holes);
    store("edge_creases",mesh->edge_creases);
    store("edge_crease_weights",mesh->edge_crease_weights);
    store("vertex_creases",mesh->vertex_creases);
    store("vertex_crease_weights",mesh->vertex_crease_weights);
    close("SubdivisionMesh");
  }